

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

SIMDShuffle * __thiscall
wasm::Builder::makeSIMDShuffle
          (Builder *this,Expression *left,Expression *right,array<unsigned_char,_16UL> *mask)

{
  SIMDShuffle *pSVar1;
  SIMDShuffle *ret;
  array<unsigned_char,_16UL> *mask_local;
  Expression *right_local;
  Expression *left_local;
  Builder *this_local;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDShuffle>(&this->wasm->allocator);
  pSVar1->left = left;
  pSVar1->right = right;
  *(undefined8 *)(pSVar1->mask)._M_elems = *(undefined8 *)mask->_M_elems;
  *(undefined8 *)((pSVar1->mask)._M_elems + 8) = *(undefined8 *)(mask->_M_elems + 8);
  ::wasm::SIMDShuffle::finalize();
  return pSVar1;
}

Assistant:

SIMDShuffle* makeSIMDShuffle(Expression* left,
                               Expression* right,
                               const std::array<uint8_t, 16>& mask) {
    auto* ret = wasm.allocator.alloc<SIMDShuffle>();
    ret->left = left;
    ret->right = right;
    ret->mask = mask;
    ret->finalize();
    return ret;
  }